

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

void google::CaptureTestStderr(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::operator+(&local_28,fLS::FLAGS_test_tmpdir_abi_cxx11_,"/captured.err");
  CaptureTestOutput(2,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

static inline void CaptureTestStderr() {
  CaptureTestOutput(STDERR_FILENO, FLAGS_test_tmpdir + "/captured.err");
}